

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O1

void deallocateMasterBarrierDisjunctVecPtrVecInt(Vec_Ptr_t *vMasterBarrierDisjunctsArg)

{
  void *__ptr;
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  if (vMasterBarrierDisjunctsArg == (Vec_Ptr_t *)0x0) {
    return;
  }
  if (0 < vMasterBarrierDisjunctsArg->nSize) {
    lVar3 = 0;
    do {
      __ptr = vMasterBarrierDisjunctsArg->pArray[lVar3];
      if (__ptr == (void *)0x0) {
        __assert_fail("vPtr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/kliveness.c"
                      ,0x1e8,"void deallocateMasterBarrierDisjunctVecPtrVecInt(Vec_Ptr_t *)");
      }
      if (0 < *(int *)((long)__ptr + 4)) {
        lVar4 = 0;
        do {
          lVar1 = *(long *)(*(long *)((long)__ptr + 8) + lVar4 * 8);
          if (0 < *(int *)(lVar1 + 4)) {
            lVar2 = 0;
            do {
              printf("%d - ",(ulong)*(uint *)(*(long *)(lVar1 + 8) + lVar2 * 4));
              lVar2 = lVar2 + 1;
            } while (lVar2 < *(int *)(lVar1 + 4));
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < *(int *)((long)__ptr + 4));
      }
      if (*(void **)((long)__ptr + 8) != (void *)0x0) {
        free(*(void **)((long)__ptr + 8));
        *(undefined8 *)((long)__ptr + 8) = 0;
      }
      free(__ptr);
      lVar3 = lVar3 + 1;
    } while (lVar3 < vMasterBarrierDisjunctsArg->nSize);
  }
  if (vMasterBarrierDisjunctsArg->pArray != (void **)0x0) {
    free(vMasterBarrierDisjunctsArg->pArray);
    vMasterBarrierDisjunctsArg->pArray = (void **)0x0;
  }
  free(vMasterBarrierDisjunctsArg);
  return;
}

Assistant:

void deallocateMasterBarrierDisjunctVecPtrVecInt(Vec_Ptr_t *vMasterBarrierDisjunctsArg)
{
	Vec_Int_t *vInt;
	Vec_Ptr_t *vPtr;
	int i, j, k, iElem;

	if(vMasterBarrierDisjunctsArg)
	{
		Vec_PtrForEachEntry(Vec_Ptr_t *, vMasterBarrierDisjunctsArg, vPtr, i)
		{	
			assert(vPtr);
			Vec_PtrForEachEntry( Vec_Int_t *, vPtr, vInt, j )
			{
				//Vec_IntFree(vInt);
				Vec_IntForEachEntry( vInt, iElem, k )
					printf("%d - ", iElem);
				//printf("Chung Chang j = %d\n", j);
			}
			Vec_PtrFree(vPtr);
		}
		Vec_PtrFree(vMasterBarrierDisjunctsArg);
	}
}